

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall
tetgenmesh::checkfac4encroach
          (tetgenmesh *this,point pa,point pb,point pc,point checkpt,double *cent,double *r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double a3;
  double a2;
  double a1;
  double a;
  double n [3];
  double local_68;
  double prjpt [3];
  double len;
  double rd;
  double *cent_local;
  point checkpt_local;
  point pc_local;
  point pb_local;
  point pa_local;
  tetgenmesh *this_local;
  
  rd = (double)cent;
  cent_local = checkpt;
  checkpt_local = pc;
  pc_local = pb;
  pb_local = pa;
  pa_local = (point)this;
  circumsphere(this,pa,pb,pc,(double *)0x0,cent,&len);
  if ((len == 0.0) && (!NAN(len))) {
    terminatetetgen(this,2);
  }
  prjpt[2] = distance(this,(double *)rd,cent_local);
  if (ABS(prjpt[2] - len) / len < this->b->epsilon) {
    prjpt[2] = len;
  }
  if (prjpt[2] < len) {
    if (this->b->metric == 0) {
      *r = len;
      return 1;
    }
    if (((pb_local[this->pointmtrindex] <= 0.0) || (pc_local[this->pointmtrindex] <= 0.0)) ||
       (checkpt_local[this->pointmtrindex] <= 0.0)) {
      return 1;
    }
    projpt2face(this,cent_local,pb_local,pc_local,checkpt_local,&local_68);
    facenormal(this,pb_local,pc_local,checkpt_local,&a,1,(double *)0x0);
    dVar1 = dot(this,&a,&a);
    dVar1 = sqrt(dVar1);
    facenormal(this,pb_local,pc_local,&local_68,&a,1,(double *)0x0);
    dVar2 = dot(this,&a,&a);
    dVar2 = sqrt(dVar2);
    facenormal(this,pc_local,checkpt_local,&local_68,&a,1,(double *)0x0);
    dVar3 = dot(this,&a,&a);
    dVar3 = sqrt(dVar3);
    facenormal(this,checkpt_local,pb_local,&local_68,&a,1,(double *)0x0);
    dVar4 = dot(this,&a,&a);
    dVar4 = sqrt(dVar4);
    if (ABS((dVar2 + dVar3 + dVar4) - dVar1) / dVar1 < this->b->epsilon) {
      len = (dVar4 / dVar1) * pc_local[this->pointmtrindex] +
            (dVar2 / dVar1) * checkpt_local[this->pointmtrindex] +
            (dVar3 / dVar1) * pb_local[this->pointmtrindex];
      dVar1 = distance(this,&local_68,cent_local);
      if (dVar1 < len) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int tetgenmesh::checkfac4encroach(point pa, point pb, point pc, point checkpt,
                                  REAL* cent, REAL* r)
{
  REAL rd, len;

  circumsphere(pa, pb, pc, NULL, cent, &rd);
  if (rd == 0) {
    terminatetetgen(this, 2);
  }
  len = distance(cent, checkpt);
  if ((fabs(len - rd) / rd) < b->epsilon) len = rd; // Rounding.
 
  if (len < rd) {
    // The point lies inside the circumsphere of this face.
    if (b->metric) { // -m option.
      if ((pa[pointmtrindex] > 0) && (pb[pointmtrindex] > 0) &&
          (pc[pointmtrindex] > 0)) {
        // Get the projection of 'checkpt' in the plane of pa, pb, and pc.
        REAL prjpt[3], n[3];
        REAL a, a1, a2, a3;
        projpt2face(checkpt, pa, pb, pc, prjpt);
        // Get the face area of [a,b,c].
        facenormal(pa, pb, pc, n, 1, NULL);
        a = sqrt(dot(n,n));
        // Get the face areas of [a,b,p], [b,c,p], and [c,a,p].
        facenormal(pa, pb, prjpt, n, 1, NULL);
        a1 = sqrt(dot(n,n));
        facenormal(pb, pc, prjpt, n, 1, NULL);
        a2 = sqrt(dot(n,n));
        facenormal(pc, pa, prjpt, n, 1, NULL);
        a3 = sqrt(dot(n,n));
        if ((fabs(a1 + a2 + a3 - a) / a) < b->epsilon) {
          // This face contains the projection.
          // Get the mesh size at the location of the projection point.
          rd = a1 / a * pc[pointmtrindex]
             + a2 / a * pa[pointmtrindex]
             + a3 / a * pb[pointmtrindex];
          len = distance(prjpt, checkpt);
          if (len < rd) {
            return 1; // Encroached.
          }
        }
      } else {
        return 1;  // No protecting ball. Encroached.
      }
    } else {
      *r = rd;
      return 1;  // Encroached.
    }
  }

  return 0;
}